

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O1

bool __thiscall
google::protobuf::io::CodedInputStream::SkipFallback
          (CodedInputStream *this,int count,int original_buffer_size)

{
  char cVar1;
  int iVar2;
  undefined4 uVar3;
  int iVar4;
  
  if (*(int *)(this + 0x2c) < 1) {
    iVar4 = count - original_buffer_size;
    *(undefined8 *)this = 0;
    *(undefined8 *)(this + 8) = 0;
    iVar2 = *(int *)(this + 0x28);
    if (*(int *)(this + 0x30) < *(int *)(this + 0x28)) {
      iVar2 = *(int *)(this + 0x30);
    }
    if (iVar2 - *(int *)(this + 0x18) < iVar4) {
      if (0 < iVar2 - *(int *)(this + 0x18)) {
        *(int *)(this + 0x18) = iVar2;
        (**(code **)(**(long **)(this + 0x10) + 0x20))();
      }
    }
    else {
      cVar1 = (**(code **)(**(long **)(this + 0x10) + 0x20))(*(long **)(this + 0x10),iVar4);
      if (cVar1 != '\0') {
        *(int *)(this + 0x18) = *(int *)(this + 0x18) + iVar4;
        return true;
      }
      uVar3 = (**(code **)(**(long **)(this + 0x10) + 0x28))();
      *(undefined4 *)(this + 0x18) = uVar3;
    }
  }
  else {
    *(long *)this = *(long *)this + (long)original_buffer_size;
  }
  return false;
}

Assistant:

bool CodedInputStream::SkipFallback(int count, int original_buffer_size) {
  if (buffer_size_after_limit_ > 0) {
    // We hit a limit inside this buffer.  Advance to the limit and fail.
    Advance(original_buffer_size);
    return false;
  }

  count -= original_buffer_size;
  buffer_ = nullptr;
  buffer_end_ = buffer_;

  // Make sure this skip doesn't try to skip past the current limit.
  int closest_limit = std::min(current_limit_, total_bytes_limit_);
  int bytes_until_limit = closest_limit - total_bytes_read_;
  if (bytes_until_limit < count) {
    // We hit the limit.  Skip up to it then fail.
    if (bytes_until_limit > 0) {
      total_bytes_read_ = closest_limit;
      input_->Skip(bytes_until_limit);
    }
    return false;
  }

  if (!input_->Skip(count)) {
    total_bytes_read_ = input_->ByteCount();
    return false;
  }
  total_bytes_read_ += count;
  return true;
}